

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void av1_reset_simple_motion_tree_partition(SIMPLE_MOTION_DATA_TREE *sms_tree,BLOCK_SIZE bsize)

{
  BLOCK_SIZE BVar1;
  byte in_SIL;
  long in_RDI;
  int idx;
  BLOCK_SIZE subsize;
  BLOCK_SIZE in_stack_ffffffffffffffef;
  int iVar2;
  undefined1 in_stack_fffffffffffffff4;
  PARTITION_TYPE in_stack_fffffffffffffff5;
  BLOCK_SIZE in_stack_fffffffffffffff6;
  
  if ((in_RDI != 0) && (*(undefined1 *)(in_RDI + 1) = 0, 2 < in_SIL)) {
    BVar1 = get_partition_subsize(in_stack_fffffffffffffff6,in_stack_fffffffffffffff5);
    for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
      av1_reset_simple_motion_tree_partition
                ((SIMPLE_MOTION_DATA_TREE *)
                 CONCAT17(in_SIL,CONCAT16(BVar1,CONCAT15(in_stack_fffffffffffffff5,
                                                         CONCAT14(in_stack_fffffffffffffff4,iVar2)))
                         ),in_stack_ffffffffffffffef);
    }
  }
  return;
}

Assistant:

void av1_reset_simple_motion_tree_partition(SIMPLE_MOTION_DATA_TREE *sms_tree,
                                            BLOCK_SIZE bsize) {
  if (sms_tree == NULL) return;
  sms_tree->partitioning = PARTITION_NONE;

  if (bsize >= BLOCK_8X8) {
    BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_SPLIT);
    for (int idx = 0; idx < 4; ++idx)
      av1_reset_simple_motion_tree_partition(sms_tree->split[idx], subsize);
  }
}